

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

Abc_Obj_t * Io_ReadCreatePo(Abc_Ntk_t *pNtk,char *pName)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pNet;
  char *pName_local;
  Abc_Ntk_t *pNtk_local;
  
  pAVar2 = Abc_NtkFindNet(pNtk,pName);
  if (pAVar2 != (Abc_Obj_t *)0x0) {
    iVar1 = Abc_ObjFaninNum(pAVar2);
    if (iVar1 == 0) {
      printf("Warning: PO \"%s\" appears twice in the list.\n",pName);
    }
  }
  pAVar2 = Abc_NtkFindOrCreateNet(pNtk,pName);
  pObj = Abc_NtkCreatePo(pNtk);
  Abc_ObjAddFanin(pObj,pAVar2);
  return pObj;
}

Assistant:

Abc_Obj_t * Io_ReadCreatePo( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet, * pTerm;
    // get the PO net
    pNet  = Abc_NtkFindNet( pNtk, pName );
    if ( pNet && Abc_ObjFaninNum(pNet) == 0 )
        printf( "Warning: PO \"%s\" appears twice in the list.\n", pName );
    pNet  = Abc_NtkFindOrCreateNet( pNtk, pName );
    // add the PO node
    pTerm = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pTerm, pNet );
    return pTerm;
}